

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_matrix.cpp
# Opt level: O1

Reals __thiscall Omega_h::matrices_times_matrices_dim<3>(Omega_h *this,Reals *a,Reals *b)

{
  int *piVar1;
  Alloc *pAVar2;
  int size_in;
  int iVar3;
  ulong uVar4;
  undefined8 uVar5;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *pvVar6;
  char *pcVar7;
  char *pcVar8;
  Reals RVar9;
  Write<double> out;
  type f;
  Write<double> local_88;
  Write<double> local_70;
  type local_60;
  
  pAVar2 = (a->write_).shared_alloc_.alloc;
  if (((ulong)pAVar2 & 1) == 0) {
    uVar4 = pAVar2->size;
  }
  else {
    uVar4 = (ulong)pAVar2 >> 3;
  }
  iVar3 = (int)(uVar4 >> 3);
  if (iVar3 * 0x38e38e39 + 0xe38e38eU < 0x1c71c71d) {
    iVar3 = iVar3 / 9;
    pAVar2 = (b->write_).shared_alloc_.alloc;
    if (((ulong)pAVar2 & 1) == 0) {
      uVar4 = pAVar2->size;
    }
    else {
      uVar4 = (ulong)pAVar2 >> 3;
    }
    size_in = iVar3 * 9;
    if (size_in == (int)(uVar4 >> 3)) {
      local_60.out.shared_alloc_.alloc = (Alloc *)&local_60.a;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"");
      Write<double>::Write(&local_88,size_in,(string *)&local_60);
      if (local_60.out.shared_alloc_.alloc != (Alloc *)&local_60.a) {
        operator_delete(local_60.out.shared_alloc_.alloc,
                        (ulong)((long)&(local_60.a.write_.shared_alloc_.alloc)->size + 1));
      }
      local_60.out.shared_alloc_.alloc = local_88.shared_alloc_.alloc;
      if (((ulong)local_88.shared_alloc_.alloc & 7) == 0 &&
          local_88.shared_alloc_.alloc != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_60.out.shared_alloc_.alloc = (Alloc *)((local_88.shared_alloc_.alloc)->size * 8 + 1)
          ;
        }
        else {
          (local_88.shared_alloc_.alloc)->use_count = (local_88.shared_alloc_.alloc)->use_count + 1;
        }
      }
      local_60.out.shared_alloc_.direct_ptr = local_88.shared_alloc_.direct_ptr;
      local_60.a.write_.shared_alloc_.alloc = (a->write_).shared_alloc_.alloc;
      if (((ulong)local_60.a.write_.shared_alloc_.alloc & 7) == 0 &&
          local_60.a.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_60.a.write_.shared_alloc_.alloc =
               (Alloc *)((local_60.a.write_.shared_alloc_.alloc)->size * 8 + 1);
        }
        else {
          (local_60.a.write_.shared_alloc_.alloc)->use_count =
               (local_60.a.write_.shared_alloc_.alloc)->use_count + 1;
        }
      }
      local_60.a.write_.shared_alloc_.direct_ptr = (a->write_).shared_alloc_.direct_ptr;
      local_60.b.write_.shared_alloc_.alloc = (b->write_).shared_alloc_.alloc;
      if (((ulong)local_60.b.write_.shared_alloc_.alloc & 7) == 0 &&
          local_60.b.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_60.b.write_.shared_alloc_.alloc =
               (Alloc *)((local_60.b.write_.shared_alloc_.alloc)->size * 8 + 1);
        }
        else {
          (local_60.b.write_.shared_alloc_.alloc)->use_count =
               (local_60.b.write_.shared_alloc_.alloc)->use_count + 1;
        }
      }
      local_60.b.write_.shared_alloc_.direct_ptr = (b->write_).shared_alloc_.direct_ptr;
      parallel_for<Omega_h::matrices_times_matrices_dim<3>(Omega_h::Read<double>,Omega_h::Read<double>)::_lambda(int)_1_>
                (iVar3,&local_60,"matrices_times_matrices");
      local_70.shared_alloc_.alloc = local_88.shared_alloc_.alloc;
      local_70.shared_alloc_.direct_ptr = local_88.shared_alloc_.direct_ptr;
      if ((((ulong)local_88.shared_alloc_.alloc & 7) == 0 &&
           local_88.shared_alloc_.alloc != (Alloc *)0x0) && (entering_parallel == '\x01')) {
        (local_88.shared_alloc_.alloc)->use_count = (local_88.shared_alloc_.alloc)->use_count + -1;
        local_70.shared_alloc_.alloc = (Alloc *)((local_88.shared_alloc_.alloc)->size * 8 + 1);
      }
      local_88.shared_alloc_.alloc = (Alloc *)0x0;
      local_88.shared_alloc_.direct_ptr = (void *)0x0;
      Read<double>::Read((Read<signed_char> *)this,&local_70);
      pAVar2 = local_70.shared_alloc_.alloc;
      if (((ulong)local_70.shared_alloc_.alloc & 7) == 0 &&
          local_70.shared_alloc_.alloc != (Alloc *)0x0) {
        piVar1 = &(local_70.shared_alloc_.alloc)->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(local_70.shared_alloc_.alloc);
          operator_delete(pAVar2,0x48);
        }
      }
      matrices_times_matrices_dim<3>(Omega_h::Read<double>,Omega_h::Read<double>)::{lambda(int)#1}::
      ~Read((_lambda_int__1_ *)&local_60);
      pAVar2 = local_88.shared_alloc_.alloc;
      pvVar6 = extraout_RDX;
      if (((ulong)local_88.shared_alloc_.alloc & 7) == 0 &&
          local_88.shared_alloc_.alloc != (Alloc *)0x0) {
        piVar1 = &(local_88.shared_alloc_.alloc)->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(local_88.shared_alloc_.alloc);
          operator_delete(pAVar2,0x48);
          pvVar6 = extraout_RDX_00;
        }
      }
      RVar9.write_.shared_alloc_.direct_ptr = pvVar6;
      RVar9.write_.shared_alloc_.alloc = (Alloc *)this;
      return (Reals)RVar9.write_.shared_alloc_;
    }
    pcVar8 = "b.size() == n * matrix_ncomps(dim, dim)";
    pcVar7 = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_matrix.cpp"
    ;
    uVar5 = 0x48;
  }
  else {
    pcVar8 = "a % b == 0";
    pcVar7 = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_scalar.hpp"
    ;
    uVar5 = 0x11a;
  }
  fail("assertion %s failed at %s +%d\n",pcVar8,pcVar7,uVar5);
}

Assistant:

Reals matrices_times_matrices_dim(Reals a, Reals b) {
  auto n = divide_no_remainder(a.size(), matrix_ncomps(dim, dim));
  OMEGA_H_CHECK(b.size() == n * matrix_ncomps(dim, dim));
  auto out = Write<Real>(n * matrix_ncomps(dim, dim));
  auto f = OMEGA_H_LAMBDA(LO i) {
    set_matrix(out, i, get_matrix<dim, dim>(a, i) * get_matrix<dim, dim>(b, i));
  };
  parallel_for(n, f, "matrices_times_matrices");
  return out;
}